

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::SetWindowPos(ImGuiWindow *window,ImVec2 *pos,ImGuiCond cond)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ImVec2 IVar8;
  ImVec2 IVar9;
  
  if ((cond == 0) || (((char)window->field_0xbc & cond) != 0)) {
    window->field_0xbc = window->field_0xbc & 0xf1;
    (window->SetWindowPosVal).x = 3.4028235e+38;
    (window->SetWindowPosVal).y = 3.4028235e+38;
    fVar6 = (float)(int)(*pos).x;
    fVar7 = (float)(int)(*pos).y;
    IVar1 = window->Pos;
    IVar2.y = fVar7;
    IVar2.x = fVar6;
    window->Pos = IVar2;
    fVar6 = fVar6 - IVar1.x;
    fVar7 = fVar7 - IVar1.y;
    if ((fVar6 != 0.0) || (((NAN(fVar6) || (fVar7 != 0.0)) || (NAN(fVar7))))) {
      if (((window->Flags & 0x100) == 0) && (GImGui->SettingsDirtyTimer <= 0.0)) {
        GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
      }
      IVar1 = (window->DC).CursorPos;
      IVar8.x = IVar1.x + fVar6;
      IVar8.y = IVar1.y + fVar7;
      (window->DC).CursorPos = IVar8;
      IVar1 = (window->DC).IdealMaxPos;
      IVar9.x = IVar1.x + fVar6;
      IVar9.y = IVar1.y + fVar7;
      (window->DC).IdealMaxPos = IVar9;
      fVar3 = (window->DC).CursorStartPos.y;
      fVar4 = (window->DC).CursorMaxPos.x;
      fVar5 = (window->DC).CursorMaxPos.y;
      (window->DC).CursorStartPos.x = (window->DC).CursorStartPos.x + fVar6;
      (window->DC).CursorStartPos.y = fVar3 + fVar7;
      (window->DC).CursorMaxPos.x = fVar4 + fVar6;
      (window->DC).CursorMaxPos.y = fVar5 + fVar7;
      return;
    }
  }
  return;
}

Assistant:

void ImGui::SetWindowPos(ImGuiWindow* window, const ImVec2& pos, ImGuiCond cond)
{
    // Test condition (NB: bit 0 is always true) and clear flags for next time
    if (cond && (window->SetWindowPosAllowFlags & cond) == 0)
        return;

    IM_ASSERT(cond == 0 || ImIsPowerOfTwo(cond)); // Make sure the user doesn't attempt to combine multiple condition flags.
    window->SetWindowPosAllowFlags &= ~(ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing);
    window->SetWindowPosVal = ImVec2(FLT_MAX, FLT_MAX);

    // Set
    const ImVec2 old_pos = window->Pos;
    window->Pos = ImFloor(pos);
    ImVec2 offset = window->Pos - old_pos;
    if (offset.x == 0.0f && offset.y == 0.0f)
        return;
    MarkIniSettingsDirty(window);
    window->DC.CursorPos += offset;         // As we happen to move the window while it is being appended to (which is a bad idea - will smear) let's at least offset the cursor
    window->DC.CursorMaxPos += offset;      // And more importantly we need to offset CursorMaxPos/CursorStartPos this so ContentSize calculation doesn't get affected.
    window->DC.IdealMaxPos += offset;
    window->DC.CursorStartPos += offset;
}